

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O2

vec_3d unit_vec(vec_3d *a)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ostream *poVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vec_3d vVar8;
  
  fVar4 = operator~(a);
  if (1e-09 <= ABS(fVar4)) {
    if ((fVar4 != 1.0) || (NAN(fVar4))) {
      uVar1 = a->x;
      uVar2 = a->y;
      auVar6._4_4_ = uVar2;
      auVar6._0_4_ = uVar1;
      auVar6._8_8_ = 0;
      auVar7._4_4_ = fVar4;
      auVar7._0_4_ = fVar4;
      auVar7._8_4_ = fVar4;
      auVar7._12_4_ = fVar4;
      auVar7 = divps(auVar6,auVar7);
      uVar5 = auVar7._0_8_;
      fVar4 = a->z / fVar4;
      goto LAB_0010191c;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"unit_vec");
    std::operator<<(poVar3,": Division by zero.");
  }
  fVar4 = 0.0;
  uVar5 = 0;
LAB_0010191c:
  vVar8.z = fVar4;
  vVar8.x = (float)(int)uVar5;
  vVar8.y = (float)(int)((ulong)uVar5 >> 0x20);
  return vVar8;
}

Assistant:

vec_3d unit_vec(const vec_3d *a) {
    float norm = ~(*a);
    vec_3d result = {0.f};

    if (fabsf(norm) < LIBQUAT_EPSILON) {
        std::cerr << __func__ << ": Division by zero.";
        return result;
    }

    if (norm != 1.F)  // perform division only if needed
    {
        result.x = a->x / norm;
        result.y = a->y / norm;
        result.z = a->z / norm;
    }

    return result;
}